

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O1

void __thiscall BanMan::SweepBanned(BanMan *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  string_view source_file;
  bool bVar3;
  int64_t iVar4;
  _Base_ptr p_Var5;
  Logger *pLVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  iterator __position;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  CSubNet sub_net;
  string log_msg;
  uint local_154;
  string local_130;
  direct_or_indirect local_110;
  uint local_100;
  _Base_ptr local_f8;
  undefined8 local_f0;
  _Base_ptr p_Stack_e8;
  undefined1 local_e0;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = GetTime();
  __position._M_node = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_banned)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    local_154 = 0;
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_110.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(__position._M_node + 1));
      local_f8 = __position._M_node[1]._M_right;
      local_e0 = *(undefined1 *)&__position._M_node[2]._M_left;
      puVar7 = &local_f0;
      local_f0 = *(undefined8 *)(__position._M_node + 2);
      p_Stack_e8 = __position._M_node[2]._M_parent;
      p_Var2 = __position._M_node[3]._M_parent;
      bVar3 = CSubNet::IsValid((CSubNet *)&local_110.indirect_contents);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      if (!bVar3 || (long)p_Var2 < iVar4) {
        std::
        _Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
        ::erase_abi_cxx11_((_Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
                            *)&this->m_banned,__position);
        this->m_is_dirty = true;
        pLVar6 = LogInstance();
        bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
        if (bVar3) {
          CSubNet::ToString_abi_cxx11_(&local_130,(CSubNet *)&local_110.indirect_contents);
          pLVar6 = LogInstance();
          bVar3 = BCLog::Logger::Enabled(pLVar6);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71((int7)((ulong)puVar7 >> 8),1);
          local_154 = (uint)args;
          if (bVar3) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            tinyformat::format<std::__cxx11::string>
                      (&local_78,(tinyformat *)"Removed banned node address/subnet: %s\n",
                       (char *)&local_130,args);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar6 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x53;
            local_78._M_string_length = 0x852e85;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/banman.cpp"
            ;
            source_file._M_len = 0x53;
            str._M_str = local_58._M_dataplus._M_p;
            str._M_len = local_58._M_string_length;
            logging_function._M_str = "SweepBanned";
            logging_function._M_len = 0xb;
            BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0xc4,NET,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_154 = 1;
        }
      }
      if (0x10 < local_100) {
        free(local_110.indirect_contents.indirect);
        local_110.indirect_contents.indirect = (char *)0x0;
      }
      __position._M_node = p_Var5;
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    if (((local_154 & 1) != 0) && (this->m_client_interface != (CClientUIInterface *)0x0)) {
      CClientUIInterface::BannedListChanged(this->m_client_interface);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::SweepBanned()
{
    AssertLockHeld(m_banned_mutex);

    int64_t now = GetTime();
    bool notify_ui = false;
    banmap_t::iterator it = m_banned.begin();
    while (it != m_banned.end()) {
        CSubNet sub_net = (*it).first;
        CBanEntry ban_entry = (*it).second;
        if (!sub_net.IsValid() || now > ban_entry.nBanUntil) {
            m_banned.erase(it++);
            m_is_dirty = true;
            notify_ui = true;
            LogDebug(BCLog::NET, "Removed banned node address/subnet: %s\n", sub_net.ToString());
        } else {
            ++it;
        }
    }

    // update UI
    if (notify_ui && m_client_interface) {
        m_client_interface->BannedListChanged();
    }
}